

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

undefined8 gmath::(anonymous_namespace)::getCameraKey_abi_cxx11_(char *key,int id)

{
  ostream *poVar1;
  int in_EDX;
  char *in_RSI;
  undefined8 in_RDI;
  ostringstream os;
  ostringstream local_190 [380];
  int local_14;
  char *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"camera.");
  if (-1 < local_14) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,local_14);
    std::operator<<(poVar1,'.');
  }
  std::operator<<((ostream *)local_190,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string getCameraKey(const char *key, int id)
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}